

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_force_event(intptr_t uuid,fio_io_event ev)

{
  fio_defer_task_s task;
  uint uVar1;
  long lVar2;
  fio_task_queue_s *queue;
  fio_lock_i ret;
  undefined1 *puVar3;
  uint local_30;
  undefined4 uStack_28;
  undefined4 uStack_24;
  uint local_18;
  
  if (uuid < 0) {
    return;
  }
  uVar1 = (uint)((ulong)uuid >> 8);
  if (fio_data->capa <= uVar1) {
    return;
  }
  lVar2 = (long)(int)uVar1 * 0xa8;
  if (*(char *)((long)fio_data + lVar2 + 0x6d) != (char)uuid) {
    return;
  }
  uStack_28 = (undefined4)uuid;
  uStack_24 = (undefined4)((ulong)uuid >> 0x20);
  if (ev == FIO_EVENT_ON_TIMEOUT) {
    puVar3 = (undefined1 *)0x0;
    local_30 = 0x12bfe9;
    local_18 = local_30;
  }
  else {
    if (ev == FIO_EVENT_ON_READY) {
      puVar3 = (undefined1 *)0x0;
      local_18 = 0x12c123;
      queue = &task_queue_urgent;
      goto LAB_0012bdc1;
    }
    if (ev != FIO_EVENT_ON_DATA) {
      return;
    }
    LOCK();
    *(undefined1 *)((long)fio_data + lVar2 + 0x6b) = 1;
    UNLOCK();
    puVar3 = &DAT_00000001;
    local_18 = 0x12bdcb;
  }
  queue = &task_queue_normal;
LAB_0012bdc1:
  task.arg1._0_4_ = uStack_28;
  task.func = (_func_void_void_ptr_void_ptr *)(ulong)local_18;
  task.arg1._4_4_ = uStack_24;
  task.arg2 = puVar3;
  fio_defer_push_task_fn(task,queue);
  return;
}

Assistant:

void fio_force_event(intptr_t uuid, enum fio_io_event ev) {
  if (!uuid_is_valid(uuid))
    return;
  switch (ev) {
  case FIO_EVENT_ON_DATA:
    fio_trylock(&uuid_data(uuid).scheduled);
    fio_defer_push_task(deferred_on_data, (void *)uuid, (void *)1);
    break;
  case FIO_EVENT_ON_TIMEOUT:
    fio_defer_push_task(deferred_ping, (void *)uuid, NULL);
    break;
  case FIO_EVENT_ON_READY:
    fio_defer_push_urgent(deferred_on_ready, (void *)uuid, NULL);
    break;
  }
}